

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

void quality_display(menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,
                    wchar_t width)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  uint8_t attr;
  
  if (oid != L'\0') {
    pcVar3 = quality_choices[oid].name;
    pcVar1 = quality_values[ignore_level[oid]].name;
    attr = '\x01';
    if (cursor) {
      attr = '\x0e';
    }
    sVar2 = utf8_strlen(pcVar3);
    if (sVar2 < 0x1e) {
      pcVar3 = format("%s%*s",pcVar3,(ulong)(0x1e - (int)sVar2)," ");
      c_put_str(attr,pcVar3,row,col);
    }
    else {
      pcVar3 = string_make(pcVar3);
      if (sVar2 != 0x1e) {
        utf8_clipto(pcVar3,0x1e);
      }
      c_put_str(attr,pcVar3,row,col);
      string_free(pcVar3);
    }
    pcVar3 = format(" : %s",pcVar1);
    c_put_str(attr,pcVar3,row,col + L'\x1e');
    return;
  }
  return;
}

Assistant:

static void quality_display(struct menu *menu, int oid, bool cursor, int row,
							int col, int width)
{
	if (oid) {
		/* Note: the order of the values in quality_choices do not
			align with the ignore_type_t enum order. - fix? NRM*/
		const char *name = quality_choices[oid].name;
		uint8_t level = ignore_level[oid];
		const char *level_name = quality_values[level].name;
		uint8_t attr = (cursor ? COLOUR_L_BLUE : COLOUR_WHITE);
		size_t u8len = utf8_strlen(name);

		if (u8len < 30) {
			c_put_str(attr, format("%s%*s", name, (int)(30 - u8len),
				" "), row, col);
		} else {
			char *name_copy = string_make(name);

			if (u8len > 30) {
				utf8_clipto(name_copy, 30);
			}
			c_put_str(attr, name_copy, row, col);
			string_free(name_copy);
		}
		c_put_str(attr, format(" : %s", level_name), row, col + 30);
	}
}